

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O3

apx_error_t
apx_program_encode_header
          (apx_program_t *program,apx_programType_t program_type,uint32_t element_size,
          uint32_t queue_size,_Bool is_dynamic)

{
  uint32_t uVar1;
  adt_bytearray_t *self;
  byte bVar2;
  char cVar3;
  uint8_t u8Size;
  apx_error_t aVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  uint8_t encoded_size [4];
  uint8_t local_48 [4];
  uint32_t local_44;
  uint local_40;
  uint local_3c;
  adt_bytearray_t *local_38;
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  if (queue_size == 0) {
    local_3c = 0;
    local_40 = 0;
    uVar8 = (ulong)element_size;
  }
  else {
    local_3c = (uint)(byte)(2 - (element_size < 0x10000));
    if (element_size < 0x100) {
      local_3c = 0;
    }
    local_40 = (uint)(byte)(2 - (queue_size < 0x10000));
    if (queue_size < 0x100) {
      local_40 = 0;
    }
    lVar6 = 1;
    if (queue_size >= 0x100) {
      lVar6 = (ulong)(0xfeff < queue_size - 0x100) * 2 + 2;
    }
    uVar8 = (ulong)queue_size * (ulong)element_size + lVar6;
    if (uVar8 >> 0x20 != 0) {
      return 7;
    }
  }
  uVar7 = (uint)uVar8;
  bVar5 = 2 - (uVar7 < 0x10000);
  u8Size = (uVar7 >= 0x10000) * '\x02' + '\x02';
  if (uVar7 < 0x100) {
    u8Size = '\x01';
    bVar5 = 0;
  }
  local_44 = element_size;
  local_38 = program;
  packLE(local_48,uVar7,u8Size);
  self = local_38;
  bVar5 = (program_type == '\x01') << 3 | bVar5;
  bVar2 = bVar5 | 0x10;
  if (!is_dynamic) {
    bVar2 = bVar5;
  }
  bVar5 = bVar2 | 0x20;
  if (queue_size == 0) {
    bVar5 = bVar2;
  }
  cVar3 = adt_bytearray_push(local_38,bVar5);
  if (cVar3 == '\0') {
    uVar1 = (0xffff < uVar7) + 2 + (uint)(0xffff < uVar7);
    if (uVar7 < 0x100) {
      uVar1 = 1;
    }
    cVar3 = adt_bytearray_append(self,local_48,uVar1);
    uVar7 = local_3c;
    if ((queue_size != 0) && (cVar3 == '\0')) {
      cVar9 = (char)local_3c;
      cVar3 = '\x03';
      if (cVar9 != '\0') {
        cVar3 = (cVar9 != '\x01') * '\x03' + '\x06';
      }
      cVar3 = adt_bytearray_push(self,(cVar3 + (char)local_40) * '\b' | 2);
      if (cVar3 == '\0') {
        uVar1 = *(uint32_t *)(&DAT_001452b0 + (long)cVar9 * 4);
        packLE(local_48,local_44,(uint8_t)(0x40201 >> ((byte)((uVar7 & 0xff) << 3) & 0x1f)));
        cVar3 = adt_bytearray_append(self,local_48,uVar1);
      }
    }
  }
  aVar4 = 0;
  if (cVar3 != '\0') {
    aVar4 = (uint)(cVar3 != '\x02') * 4 + 2;
  }
  return aVar4;
}

Assistant:

apx_error_t apx_program_encode_header(apx_program_t* program, apx_programType_t program_type, uint32_t element_size, uint32_t queue_size, bool is_dynamic)
{
   adt_error_t rc = ADT_NO_ERROR;
   uint8_t encoded_size[APX_VM_UINT32_SIZE] = { 0u, 0u, 0u, 0u };
   uint8_t data_size_variant = 0u;
   uint32_t packed_size = 0u;
   uint32_t data_size = 0u;
   uint8_t queue_variant = 0u; //Only used when is_queued is true
   uint8_t element_variant = 0u; //Only used when is_queued is true
   uint8_t program_byte = 0u;
   uint8_t* p = &encoded_size[0];
   bool const is_queued = queue_size > 0u;

   if (is_queued)
   {
      queue_variant = (queue_size <= UINT8_MAX) ? APX_VM_VARIANT_UINT8 : (queue_size <= UINT16_MAX) ? APX_VM_VARIANT_UINT16 : APX_VM_VARIANT_UINT32;
      element_variant = (element_size <= UINT8_MAX) ? APX_VM_VARIANT_UINT8 : (element_size <= UINT16_MAX) ? APX_VM_VARIANT_UINT16 : APX_VM_VARIANT_UINT32;
      uint32_t const queue_length_size = (queue_variant == APX_VM_VARIANT_UINT8) ? UINT8_SIZE : (queue_variant == APX_VM_VARIANT_UINT16) ? UINT16_SIZE : UINT32_SIZE;
      uint64_t const tmp = queue_length_size + (((uint64_t)element_size) * queue_size);
      if (tmp > UINT32_MAX)
      {
         return APX_LENGTH_ERROR;
      }
      data_size = (uint32_t)tmp;
   }
   else
   {
      data_size = element_size;
   }

   //determine value of data_size_variant
   if (data_size <= UINT8_MAX)
   {
      data_size_variant = APX_VM_VARIANT_UINT8;
      packLE(p, data_size, (uint8_t)UINT8_SIZE);
      p += UINT8_SIZE;
   }
   else if (data_size <= UINT16_MAX)
   {
      data_size_variant = APX_VM_VARIANT_UINT16;
      packLE(p, data_size, (uint8_t)UINT16_SIZE);
      p += UINT16_SIZE;
   }
   else
   {
      data_size_variant = APX_VM_VARIANT_UINT32;
      packLE(p, data_size, (uint8_t)UINT32_SIZE);
      p += UINT32_SIZE;
   }
   packed_size = (uint32_t)(p - &encoded_size[0]);
   assert((packed_size > 0) && (packed_size <= UINT32_SIZE));

   program_byte = encode_program_byte(program_type, is_dynamic, is_queued, data_size_variant);
   rc = adt_bytearray_push(program, program_byte);
   if (rc == ADT_NO_ERROR)
   {
      rc = adt_bytearray_append(program, &encoded_size[0], packed_size);
   }
   if ((rc == ADT_NO_ERROR) && is_queued)
   {
      uint8_t const opcode = APX_VM_OPCODE_DATA_SIZE;
      uint8_t const variant = calc_data_size_variant(element_variant, queue_variant);
      uint8_t const instruction = apx_program_encode_instruction(opcode, variant, false);
      rc = adt_bytearray_push(program, instruction);
      if (rc == ADT_NO_ERROR)
      {
         p = &encoded_size[0];
         switch (element_variant)
         {
         case APX_VM_VARIANT_UINT8:
            packLE(p, element_size, (uint8_t)UINT8_SIZE);
            p += UINT8_SIZE;
            break;
         case APX_VM_VARIANT_UINT16:
            packLE(p, element_size, (uint8_t)UINT16_SIZE);
            p += UINT16_SIZE;
            break;
         case APX_VM_VARIANT_UINT32:
            packLE(p, element_size, (uint8_t)UINT32_SIZE);
            p += UINT32_SIZE;
            break;
         default:
            assert(0);
            return APX_VALUE_TYPE_ERROR;
         }
         packed_size = (uint32_t)(p - &encoded_size[0]);
         assert((packed_size > 0) && (packed_size <= UINT32_SIZE));
         rc = adt_bytearray_append(program, &encoded_size[0], packed_size);
      }
   }

   if (rc != ADT_NO_ERROR)
   {
      if (rc == ADT_MEM_ERROR)
      {
         return APX_MEM_ERROR;
      }
      else
      {
         return APX_INTERNAL_ERROR;
      }
   }
   return APX_NO_ERROR;
}